

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

bool __thiscall rw::Camera::streamWrite(Camera *this,Stream *stream)

{
  uint32 size;
  V2d local_38;
  CameraChunkData buf;
  Stream *stream_local;
  Camera *this_local;
  
  buf._24_8_ = stream;
  size = streamGetSize(this);
  writeChunkHeader(stream,5,size);
  writeChunkHeader((Stream *)buf._24_8_,1,0x20);
  local_38 = this->viewWindow;
  buf.viewWindow = this->viewOffset;
  buf.viewOffset.x = this->nearPlane;
  buf.viewOffset.y = this->farPlane;
  buf.nearPlane = this->fogPlane;
  buf.farPlane = (float32)this->projection;
  Stream::write32((Stream *)buf._24_8_,&local_38,0x20);
  PluginList::streamWrite((PluginList *)&s_plglist,(Stream *)buf._24_8_,this);
  return true;
}

Assistant:

bool
Camera::streamWrite(Stream *stream)
{
	CameraChunkData buf;
	writeChunkHeader(stream, ID_CAMERA, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(CameraChunkData));
	buf.viewWindow = this->viewWindow;
	buf.viewOffset = this->viewOffset;
	buf.nearPlane = this->nearPlane;
	buf.farPlane  = this->farPlane;
	buf.fogPlane = this->fogPlane;
	buf.projection = this->projection;
	stream->write32(&buf, sizeof(CameraChunkData));
	s_plglist.streamWrite(stream, this);
	return true;
}